

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

mat<double,_3,_3> *
linalg::qmat<double>(mat<double,_3,_3> *__return_storage_ptr__,vec<double,_4> *q)

{
  double local_50;
  double dStack_48;
  double local_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  qxdir<double>(q);
  qydir<double>(q);
  qzdir<double>(q);
  (__return_storage_ptr__->x).z = local_28;
  (__return_storage_ptr__->x).x = local_38;
  (__return_storage_ptr__->x).y = dStack_30;
  (__return_storage_ptr__->y).x = local_50;
  (__return_storage_ptr__->y).y = dStack_48;
  (__return_storage_ptr__->y).z = local_40;
  return __return_storage_ptr__;
}

Assistant:

vec<T,3>             qaxis (const vec<T,4> & q)                          { return normalize(q.xyz()); }